

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialer.c
# Opt level: O2

void nni_dialer_close(nni_dialer *d)

{
  nni_mtx_lock(&dialers_lk);
  if (d->d_closed == true) {
    nni_mtx_unlock(&dialers_lk);
  }
  else {
    d->d_closed = true;
    nni_id_remove(&dialers,(ulong)d->d_id);
    nni_mtx_unlock(&dialers_lk);
    nni_dialer_shutdown(d);
    nni_sock_remove_dialer(d);
  }
  nni_dialer_rele(d);
  return;
}

Assistant:

void
nni_dialer_close(nni_dialer *d)
{
	nni_mtx_lock(&dialers_lk);
	if (d->d_closed) {
		nni_mtx_unlock(&dialers_lk);
		nni_dialer_rele(d);
		return;
	}
	d->d_closed = true;
	nni_id_remove(&dialers, d->d_id);
	nni_mtx_unlock(&dialers_lk);

	nni_dialer_shutdown(d);

	nni_sock_remove_dialer(d);
	nni_dialer_rele(d);
}